

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_crc32.c
# Opt level: O0

ngx_int_t ngx_crc32_table_init(void)

{
  void *pvVar1;
  uint32_t *__dest;
  void *p;
  
  if ((uint32_t *)((ulong)ngx_crc32_table_short & (ngx_cacheline_size - 1 ^ 0xffffffffffffffff)) ==
      ngx_crc32_table_short) {
    p = (void *)0x0;
  }
  else {
    pvVar1 = ngx_alloc(ngx_cacheline_size + 0x40,ngx_cycle->log);
    if (pvVar1 == (void *)0x0) {
      p = (void *)0xffffffffffffffff;
    }
    else {
      __dest = (uint32_t *)
               ((long)pvVar1 + (ngx_cacheline_size - 1) &
               (ngx_cacheline_size - 1 ^ 0xffffffffffffffff));
      memcpy(__dest,ngx_crc32_table16,0x40);
      p = (void *)0x0;
      ngx_crc32_table_short = __dest;
    }
  }
  return (ngx_int_t)p;
}

Assistant:

ngx_int_t
ngx_crc32_table_init(void)
{
    void  *p;

    if (((uintptr_t) ngx_crc32_table_short
          & ~((uintptr_t) ngx_cacheline_size - 1))
        == (uintptr_t) ngx_crc32_table_short)
    {
        return NGX_OK;
    }

    p = ngx_alloc(16 * sizeof(uint32_t) + ngx_cacheline_size, ngx_cycle->log);
    if (p == NULL) {
        return NGX_ERROR;
    }

    p = ngx_align_ptr(p, ngx_cacheline_size);

    ngx_memcpy(p, ngx_crc32_table16, 16 * sizeof(uint32_t));

    ngx_crc32_table_short = p;

    return NGX_OK;
}